

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# seg_helper.c
# Opt level: O2

void do_interrupt_all(CPUM68KState_conflict *env,int is_hw)

{
  int iVar1;
  uint uVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  uint16_t format;
  abi_ptr_conflict aVar6;
  uint uVar7;
  uint uVar8;
  target_ulong_conflict addr;
  uint uVar9;
  uint uVar10;
  uint local_44;
  ulong local_40;
  uint32_t local_34;
  
  if ((env->features & 1) == 0) {
    uVar10 = env->pc;
    uVar2 = *(uint *)(env[-3].fregs + 2);
    local_40 = (ulong)uVar10;
    if (is_hw == 0) {
      if (uVar2 == 0x100) {
        aVar6 = env->aregs[7];
        uVar3 = cpu_ldl_mmuidx_ra_m68k(env,aVar6,0,0);
        uVar4 = cpu_ldl_mmuidx_ra_m68k(env,aVar6 + 4,0,0);
        env->pc = uVar4;
        env->aregs[7] = (uVar3 >> 0x1c & 3 | aVar6) + 8;
        cpu_m68k_set_sr_m68k(env,uVar3);
        return;
      }
      if (uVar2 == 0x101) {
        *(undefined4 *)((long)env[-3].fregs + 0x18) = 1;
        *(undefined4 *)(env[-3].fregs + 2) = 0x10001;
        cpu_loop_exit_m68k((CPUState *)(env[-0x40].fregs + 2));
      }
      local_40 = (ulong)(uVar10 + 2);
      if ((uVar2 & 0xfffffff0) != 0x20) {
        local_40 = (ulong)uVar10;
      }
    }
    local_34 = env->sr;
    uVar3 = cpu_m68k_get_ccr_m68k(env);
    uVar10 = env->sr;
    env->sr = uVar10 | 0x2000;
    if (is_hw != 0) {
      env->sr = (env->pending_level & 0xffffffcfU) << 8 | uVar10 & 0xffffe8ff | 0x2000;
    }
    m68k_switch_sp_m68k(env);
    uVar10 = env->aregs[7];
    uVar9 = uVar2 << 0x12 | local_34;
    uVar8 = uVar10 & 0xfffffffc;
    cpu_stl_mmuidx_ra_m68k(env,uVar8 - 4,(uint32_t)local_40,0,0);
    addr = uVar8 - 8;
    cpu_stl_mmuidx_ra_m68k(env,addr,uVar9 | uVar3 | (uVar10 & 3) << 0x1c | 0x40000000,0,0);
    env->aregs[7] = addr;
    aVar6 = uVar2 * 4 + env->vbr;
    goto LAB_0066d079;
  }
  uVar3 = env->pc;
  iVar1 = *(int *)(env[-3].fregs + 2);
  if (is_hw == 0) {
    if (iVar1 - 0x20U < 0x10) {
      uVar3 = uVar3 + 2;
    }
    else if (iVar1 == 0x100) {
      uVar3 = env->aregs[7];
      while( true ) {
        uVar4 = cpu_lduw_mmuidx_ra_m68k(env,uVar3,0,0);
        uVar5 = cpu_ldl_mmuidx_ra_m68k(env,uVar3 + 2,0,0);
        env->pc = uVar5;
        aVar6 = uVar3 + 6;
        if ((env->features & 0x40000) == 0) break;
        uVar5 = cpu_lduw_mmuidx_ra_m68k(env,aVar6,0,0);
        switch(uVar5 >> 0xc & 0xf) {
        case 1:
          uVar3 = uVar3 + 8;
          env->aregs[7] = uVar3;
          cpu_m68k_set_sr_m68k(env,uVar4 & 0xffff);
          break;
        case 2:
        case 3:
          aVar6 = uVar3 + 0xc;
          goto LAB_0066d396;
        case 4:
          aVar6 = uVar3 + 0x10;
          goto LAB_0066d396;
        default:
          aVar6 = uVar3 + 8;
          goto LAB_0066d396;
        case 7:
          aVar6 = uVar3 + 0x3c;
          goto LAB_0066d396;
        }
      }
LAB_0066d396:
      env->aregs[7] = aVar6;
      cpu_m68k_set_sr_m68k(env,uVar4 & 0xffff);
      return;
    }
  }
  local_40 = CONCAT44(local_40._4_4_,uVar3);
  uVar10 = env->sr;
  uVar3 = cpu_m68k_get_ccr_m68k(env);
  uVar10 = uVar3 | uVar10;
  uVar2 = uVar10 & 0x1fff | 0x2000;
  if (is_hw != 0) {
    uVar2 = uVar2 | env->pending_level << 8 | env->sr & 0xd8ff;
  }
  uVar9 = uVar2 & 0xffff;
  cpu_m68k_set_sr_m68k(env,uVar9);
  uVar7 = env->aregs[7] & 0xfffffffe;
  uVar8 = *(uint *)(env[-3].fregs + 2);
  uVar3 = (uint32_t)local_40;
  local_44 = uVar7;
  switch(uVar8) {
  case 2:
    if ((env->mmu).fault == true) {
      cpu_abort_m68k((CPUState *)(env[-0x40].fregs + 2),"DOUBLE MMU FAULT\n");
    }
    (env->mmu).fault = true;
    cpu_stl_mmuidx_ra_m68k(env,uVar7 - 4,0,0,0);
    cpu_stl_mmuidx_ra_m68k(env,uVar7 - 8,0,0,0);
    cpu_stl_mmuidx_ra_m68k(env,uVar7 - 0xc,0,0,0);
    cpu_stl_mmuidx_ra_m68k(env,uVar7 - 0x10,0,0,0);
    cpu_stl_mmuidx_ra_m68k(env,uVar7 - 0x14,0,0,0);
    cpu_stl_mmuidx_ra_m68k(env,uVar7 - 0x18,0,0,0);
    cpu_stl_mmuidx_ra_m68k(env,uVar7 - 0x1c,0,0,0);
    cpu_stl_mmuidx_ra_m68k(env,uVar7 - 0x20,0,0,0);
    cpu_stl_mmuidx_ra_m68k(env,uVar7 - 0x24,(env->mmu).ar,0,0);
    cpu_stl_mmuidx_ra_m68k(env,uVar7 - 0x28,(env->mmu).ar,0,0);
    cpu_stw_mmuidx_ra_m68k(env,uVar7 - 0x2a,0,0,0);
    cpu_stw_mmuidx_ra_m68k(env,uVar7 - 0x2c,0,0,0);
    cpu_stw_mmuidx_ra_m68k(env,uVar7 - 0x2e,0,0,0);
    cpu_stw_mmuidx_ra_m68k(env,uVar7 - 0x30,(env->mmu).ssw,0,0);
    local_44 = uVar7 - 0x34;
    cpu_stl_mmuidx_ra_m68k(env,local_44,(env->mmu).ar,0,0);
    do_stack_frame(env,&local_44,7,(uint16_t)uVar10,0,(uint32_t)local_40);
    (env->mmu).fault = false;
    goto LAB_0066cf80;
  case 3:
    uVar4 = 0;
    break;
  case 4:
  case 5:
  case 6:
  case 7:
  case 9:
    uVar4 = env->pc;
    break;
  default:
    do_stack_frame(env,&local_44,0,(uint16_t)uVar10,0,(uint32_t)local_40);
    if ((uVar8 & 0xfffffff8) != 0x18 || ((uVar10 >> 0xc & 1) == 0 || is_hw == 0)) goto LAB_0066cf80;
    env->aregs[7] = local_44;
    cpu_m68k_set_sr_m68k(env,uVar2 & 0xefff);
    format = 1;
    uVar4 = 0;
    local_44 = env->aregs[7] & 0xfffffffe;
    goto LAB_0066cf7b;
  }
  format = 2;
  uVar9 = uVar10 & 0xffff;
LAB_0066cf7b:
  do_stack_frame(env,&local_44,format,(uint16_t)uVar9,uVar4,uVar3);
LAB_0066cf80:
  env->aregs[7] = local_44;
  aVar6 = iVar1 * 4 + env->vbr;
LAB_0066d079:
  uVar3 = cpu_ldl_mmuidx_ra_m68k(env,aVar6,0,0);
  env->pc = uVar3;
  return;
}

Assistant:

static void do_interrupt_all(X86CPU *cpu, int intno, int is_int,
                             int error_code, target_ulong next_eip, int is_hw)
{
    CPUX86State *env = &cpu->env;

#if 0
    if (qemu_loglevel_mask(CPU_LOG_INT)) {
        if ((env->cr[0] & CR0_PE_MASK)) {
            // static int count;

            qemu_log("%6d: v=%02x e=%04x i=%d cpl=%d IP=%04x:" TARGET_FMT_lx
                     " pc=" TARGET_FMT_lx " SP=%04x:" TARGET_FMT_lx,
                     count, intno, error_code, is_int,
                     env->hflags & HF_CPL_MASK,
                     env->segs[R_CS].selector, env->eip,
                     (int)env->segs[R_CS].base + env->eip,
                     env->segs[R_SS].selector, env->regs[R_ESP]);
            if (intno == 0x0e) {
                qemu_log(" CR2=" TARGET_FMT_lx, env->cr[2]);
            } else {
                qemu_log(" env->regs[R_EAX]=" TARGET_FMT_lx, env->regs[R_EAX]);
            }
            qemu_log("\n");
            log_cpu_state(CPU(cpu), CPU_DUMP_CCOP);
#if 0
            {
                int i;
                target_ulong ptr;

                qemu_log("       code=");
                ptr = env->segs[R_CS].base + env->eip;
                for (i = 0; i < 16; i++) {
                    qemu_log(" %02x", ldub(ptr + i));
                }
                qemu_log("\n");
            }
#endif
            count++;
        }
    }
#endif

    if (env->cr[0] & CR0_PE_MASK) {
        if (env->hflags & HF_GUEST_MASK) {
            handle_even_inj(env, intno, is_int, error_code, is_hw, 0);
        }
#ifdef TARGET_X86_64
        if (env->hflags & HF_LMA_MASK) {
            do_interrupt64(env, intno, is_int, error_code, next_eip, is_hw);
        } else
#endif
        {
            do_interrupt_protected(env, intno, is_int, error_code, next_eip,
                                   is_hw);
        }
    } else {
        if (env->hflags & HF_GUEST_MASK) {
            handle_even_inj(env, intno, is_int, error_code, is_hw, 1);
        }
        do_interrupt_real(env, intno, is_int, error_code, next_eip);
    }

    if (env->hflags & HF_GUEST_MASK) {
        CPUState *cs = CPU(cpu);
        uint32_t event_inj = x86_ldl_phys(cs, env->vm_vmcb +
                                      offsetof(struct vmcb,
                                               control.event_inj));

        x86_stl_phys(cs,
                 env->vm_vmcb + offsetof(struct vmcb, control.event_inj),
                 event_inj & ~SVM_EVTINJ_VALID);
    }
}